

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * __thiscall
Diligent::GetBufferViewTypeLiteralName(Diligent::BUFFER_VIEW_TYPE)::BuffViewTypeToLiteralNameMap::
operator[](Diligent::BUFFER_VIEW_TYPE__const(void *this,BUFFER_VIEW_TYPE ViewType)

{
  const_reference ppcVar1;
  Char *Message;
  char local_48 [4];
  uint local_44;
  undefined1 local_40 [8];
  string msg;
  BUFFER_VIEW_TYPE ViewType_local;
  BuffViewTypeToLiteralNameMap *this_local;
  
  msg.field_2._M_local_buf[0xf] = ViewType;
  if (ViewType < BUFFER_VIEW_NUM_VIEWS) {
    ppcVar1 = std::array<const_char_*,_3UL>::operator[]
                        ((array<const_char_*,_3UL> *)this,(ulong)ViewType);
    this_local = (BuffViewTypeToLiteralNameMap *)*ppcVar1;
  }
  else {
    local_44 = (uint)ViewType;
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    FormatString<char[19],unsigned_int,char[31],unsigned_int,char[2]>
              ((string *)local_40,(Diligent *)"Buffer view type (",(char (*) [19])&local_44,
               (uint *)") is out of allowed range [0, ",(char (*) [31])local_48,(uint *)0xef0e6a,
               (char (*) [2])local_40);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x2fc);
    std::__cxx11::string::~string((string *)local_40);
    this_local = (BuffViewTypeToLiteralNameMap *)anon_var_dwarf_26b3127;
  }
  return (Char *)this_local;
}

Assistant:

const Char* operator[](BUFFER_VIEW_TYPE ViewType) const
        {
            if (ViewType >= BUFFER_VIEW_UNDEFINED && ViewType < BUFFER_VIEW_NUM_VIEWS)
            {
                return BuffViewLiteralNames[ViewType];
            }
            else
            {
                UNEXPECTED("Buffer view type (", static_cast<Uint32>(ViewType), ") is out of allowed range [0, ", static_cast<Uint32>(BUFFER_VIEW_NUM_VIEWS) - 1, "]");
                return "<Unknown buffer view type>";
            }
        }